

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O2

int fs_st_mode(string_view path)

{
  int iVar1;
  int *piVar2;
  stat s;
  statx sx;
  
  iVar1 = statx(0xffffffffffffff9c,path._M_str,0x800,2,&sx);
  if (iVar1 == 0) {
    s.st_mode = (__mode_t)sx.stx_mode;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 != 0x26) || (iVar1 = stat(path._M_str,(stat *)&s), iVar1 != 0)) {
      s.st_mode = 0;
    }
  }
  return s.st_mode;
}

Assistant:

int
fs_st_mode(std::string_view path)
{
  int r = 0;
#if defined(STATX_MODE) && defined(USE_STATX)
// Linux Glibc only
// https://www.gnu.org/software/gnulib/manual/html_node/statx.html
// https://www.man7.org/linux/man-pages/man2/statx.2.html

  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_MODE, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_mode;
#endif

// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/stat-functions
  if(r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_mode;
  }

  return 0;
}